

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix4d * __thiscall
math::Matrix4d::rotate_z(Matrix4d *__return_storage_ptr__,Matrix4d *this,double r)

{
  double *pdVar1;
  double dVar2;
  undefined1 local_a0 [8];
  Matrix4d ret;
  double r_local;
  Matrix4d *this_local;
  
  ret.m_buffer[3][3] = r;
  identity();
  dVar2 = cos(ret.m_buffer[3][3]);
  pdVar1 = operator()((Matrix4d *)local_a0,0,0);
  *pdVar1 = dVar2;
  dVar2 = sin(ret.m_buffer[3][3]);
  pdVar1 = operator()((Matrix4d *)local_a0,0,1);
  *pdVar1 = -dVar2;
  dVar2 = sin(ret.m_buffer[3][3]);
  pdVar1 = operator()((Matrix4d *)local_a0,1,0);
  *pdVar1 = dVar2;
  dVar2 = cos(ret.m_buffer[3][3]);
  pdVar1 = operator()((Matrix4d *)local_a0,1,1);
  *pdVar1 = dVar2;
  operator*(__return_storage_ptr__,(Matrix4d *)local_a0,this);
  return __return_storage_ptr__;
}

Assistant:

math::Matrix4d math::Matrix4d::rotate_z(double r) const
{
    Matrix4d ret{identity()};
    ret(0, 0) = std::cos(r);
    ret(0, 1) = -std::sin(r);
    ret(1, 0) = std::sin(r);
    ret(1, 1) = std::cos(r);
    return (ret * (*this));
}